

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

int os_get_abs_filename(char *buf,size_t buflen,char *filename)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *in_RDX;
  size_t in_RSI;
  unique_ptr<char,_void_(*)(void_*)> *in_RDI;
  unique_ptr<char,_void_(*)(void_*)> newpath;
  char pwd [4096];
  pointer in_stack_ffffffffffffefa8;
  unique_ptr<char,_void_(*)(void_*)> *in_stack_ffffffffffffefb0;
  size_t in_stack_ffffffffffffefb8;
  unique_ptr<char,_void_(*)(void_*)> *in_stack_ffffffffffffefc0;
  char local_1018 [40];
  char *in_stack_fffffffffffff010;
  
  iVar2 = os_is_file_absolute(in_stack_ffffffffffffefa8);
  if (iVar2 == 0) {
    pcVar3 = getcwd(local_1018,0x1000);
    if (pcVar3 == (char *)0x0) {
      safe_strcpy((char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                  (char *)in_stack_ffffffffffffefb0);
    }
    else {
      os_build_full_path((char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                         (char *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
    }
  }
  else {
    safe_strcpy((char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                (char *)in_stack_ffffffffffffefb0);
  }
  canonicalize_path(in_stack_fffffffffffff010);
  realpath(in_RDX,(char *)0x0);
  std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            (in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x1129f4);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr<char,_void_(*)(void_*)> *)0x1129fe);
  if (bVar1) {
    std::unique_ptr<char,_void_(*)(void_*)>::get(in_RDI);
    safe_strcpy((char *)in_stack_ffffffffffffefc0,in_RSI,(char *)in_RDI);
  }
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(in_stack_ffffffffffffefc0);
  return 1;
}

Assistant:

int
os_get_abs_filename( char* buf, size_t buflen, const char* filename )
{
    // If the filename is already absolute, copy it; otherwise combine
    // it with the working directory.
    if (os_is_file_absolute(filename))
    {
        // absolute - copy it as-is
        safe_strcpy(buf, buflen, filename);
    }
    else
    {
        // combine it with the working directory to get the path
        char pwd[OSFNMAX];
        if (getcwd(pwd, sizeof(pwd)) != 0)
            os_build_full_path(buf, buflen, pwd, filename);
        else
            safe_strcpy(buf, buflen, filename);
    }

    // canonicalize the result
    canonicalize_path(buf);

    // Try getting the canonical path from the OS (allocating the
    // result buffer).
    const std::unique_ptr<char, decltype(&free)>
            newpath(realpath(filename, nullptr), &free);
    if (newpath) {
        // Copy the output (truncating if it's too long).
        safe_strcpy(buf, buflen, newpath.get());
    }

    // realpath() might have failed, but that's okay - realpath() only works
    // if the path refers to an existing file, but it's valid for callers to
    // pass non-existent filenames, such as names of files they're about to
    // create, or hypothetical paths being used for comparison purposes or
    // for future use.  Simply return the canonical path name we generated
    // above.
    return true;
}